

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

Var Js::JavascriptRegExp::EntryCompile(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Type TVar5;
  charcount_t csz;
  int iVar6;
  int iVar7;
  charcount_t cszOpts;
  undefined4 *puVar8;
  JavascriptRegExp *pJVar9;
  Var pvVar10;
  JavascriptRegExp *pJVar11;
  RecyclableObject *pRVar12;
  JavascriptString *pJVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RegexPattern *pRVar14;
  RegexPattern *pRVar15;
  int in_stack_00000010;
  undefined1 local_50 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  char16 *pszOpts;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (uint)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x222,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d1551a;
    *puVar8 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_50 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_50,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pJVar9 = GetJavascriptRegExp((Arguments *)local_50,L"RegExp.prototype.compile",pSVar1);
  if (((uint)args.super_Arguments.Values & 0xffffff) == 1) {
    pRVar14 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->emptyRegexPattern).ptr;
    pRVar15 = (RegexPattern *)0x0;
    goto LAB_00d154c6;
  }
  pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
  bVar3 = VarIs<Js::JavascriptRegExp>(pvVar10);
  pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
  if (!bVar3) {
    bVar3 = VarIs<Js::JavascriptString>(pvVar10);
    pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
    if (bVar3) {
      pJVar13 = VarTo<Js::JavascriptString>(pvVar10);
    }
    else {
      if (pvVar10 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00d1551a;
        *puVar8 = 0;
      }
      if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
          ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00d1551a;
        *puVar8 = 0;
      }
      if ((ulong)pvVar10 >> 0x32 == 0 && ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
        pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
        if (pRVar12 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00d1551a;
          *puVar8 = 0;
        }
        TVar5 = ((pRVar12->type).ptr)->typeId;
        if (0x57 < (int)TVar5) {
          BVar4 = RecyclableObject::IsExternal(pRVar12);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar3) goto LAB_00d1551a;
            *puVar8 = 0;
          }
          TVar5 = TypeIds_FirstNumberType;
        }
      }
      else {
        TVar5 = TypeIds_FirstNumberType;
      }
      if (TVar5 == TypeIds_Undefined) {
        pJVar13 = JavascriptLibrary::GetEmptyString
                            ((pSVar1->super_ScriptContextBase).javascriptLibrary);
      }
      else {
        pvVar10 = Arguments::operator[]((Arguments *)local_50,1);
        pJVar13 = JavascriptConversion::ToString(pvVar10,pSVar1);
      }
    }
    csz = JavascriptString::GetLength(pJVar13);
    iVar6 = (*(pJVar13->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar13);
    if (((uint)args.super_Arguments.Values & 0xffffff) < 3) {
      cszOpts = 0;
      pszOpts = (char16 *)0x0;
    }
    else {
      pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar10);
      if (BVar4 == 0) {
        pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
        bVar3 = VarIs<Js::JavascriptString>(pvVar10);
        pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
        if (bVar3) {
          pJVar13 = VarTo<Js::JavascriptString>(pvVar10);
        }
        else {
          pJVar13 = JavascriptConversion::ToString(pvVar10,pSVar1);
        }
        iVar7 = (*(pJVar13->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar13);
        pszOpts = (char16 *)CONCAT44(extraout_var_00,iVar7);
        cszOpts = JavascriptString::GetLength(pJVar13);
      }
      else {
        cszOpts = 0;
        pszOpts = (char16 *)0x0;
      }
    }
    pRVar15 = (RegexPattern *)0x0;
    pRVar14 = RegexHelper::CompileDynamic
                        (pSVar1,(char16 *)CONCAT44(extraout_var,iVar6),csz,pszOpts,cszOpts,false);
    goto LAB_00d154c6;
  }
  pJVar11 = VarTo<Js::JavascriptRegExp>(pvVar10);
  pRVar14 = (pJVar11->pattern).ptr;
  pRVar15 = (pJVar11->splitPattern).ptr;
  if (((uint)args.super_Arguments.Values & 0xffffff) < 3) goto LAB_00d154c6;
  pvVar10 = Arguments::operator[]((Arguments *)local_50,2);
  if (pvVar10 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d1551a;
    *puVar8 = 0;
  }
  if (((ulong)pvVar10 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar10 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d1551a;
    *puVar8 = 0;
  }
  if ((ulong)pvVar10 >> 0x32 == 0 && ((ulong)pvVar10 & 0xffff000000000000) != 0x1000000000000) {
    pRVar12 = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    if (pRVar12 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d1551a;
      *puVar8 = 0;
    }
    TVar5 = ((pRVar12->type).ptr)->typeId;
    if (0x57 < (int)TVar5) {
      BVar4 = RecyclableObject::IsExternal(pRVar12);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00d1551a:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      goto LAB_00d15199;
    }
  }
  else {
LAB_00d15199:
    TVar5 = TypeIds_FirstNumberType;
  }
  if (TVar5 != TypeIds_Undefined) {
    JavascriptError::ThrowSyntaxError(pSVar1,-0x7ff5ec67,(PCWSTR)0x0);
  }
LAB_00d154c6:
  Memory::Recycler::WBSetBit((char *)&pJVar9->pattern);
  (pJVar9->pattern).ptr = pRVar14;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar9->pattern);
  Memory::Recycler::WBSetBit((char *)&pJVar9->splitPattern);
  (pJVar9->splitPattern).ptr = pRVar15;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pJVar9->splitPattern);
  (pJVar9->lastIndexVar).ptr = (void *)0x0;
  pJVar9->lastIndexOrFlag = 0;
  return pJVar9;
}

Assistant:

Var JavascriptRegExp::EntryCompile(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        JavascriptRegExp* thisRegularExpression = GetJavascriptRegExp(args, _u("RegExp.prototype.compile"), scriptContext);

        UnifiedRegex::RegexPattern* pattern;
        UnifiedRegex::RegexPattern* splitPattern = nullptr;

        if (callInfo.Count == 1 )
        {
            pattern = scriptContext->GetLibrary()->GetEmptyRegexPattern();
        }
        else if (VarIs<JavascriptRegExp>(args[1]))
        {
            JavascriptRegExp* source = VarTo<JavascriptRegExp>(args[1]);
            //compile with a regular expression
            pattern = source->GetPattern();
            splitPattern = source->GetSplitPattern();
            // second arg must be undefined if a reg expression is passed
            if(callInfo.Count > 2 &&  JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JavascriptError::ThrowSyntaxError(scriptContext, JSERR_RegExpSyntax);
            }
        }
        else
        {
            //compile with a string
            JavascriptString * strBody;
            if (VarIs<JavascriptString>(args[1]))
            {
                strBody = VarTo<JavascriptString>(args[1]);
            }
            else if(JavascriptOperators::GetTypeId(args[1]) == TypeIds_Undefined)
            {
                strBody = scriptContext->GetLibrary()->GetEmptyString();
            }
            else
            {
                strBody = JavascriptConversion::ToString(args[1], scriptContext);
            }

            int cBody = strBody->GetLength();
            const char16 *szRegex = strBody->GetSz(); // must be null terminated!
            int cOpts = 0;
            const char16 *szOptions = nullptr;

            JavascriptString * strOptions = nullptr;
            if (callInfo.Count > 2 && !JavascriptOperators::IsUndefinedObject(args[2]))
            {
                if (VarIs<JavascriptString>(args[2]))
                {
                    strOptions = VarTo<JavascriptString>(args[2]);
                }
                else
                {
                    strOptions = JavascriptConversion::ToString(args[2], scriptContext);
                }

                szOptions = strOptions->GetSz(); // must be null terminated!
                cOpts = strOptions->GetLength();
            }

            pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);
        }

        thisRegularExpression->SetPattern(pattern);
        thisRegularExpression->SetSplitPattern(splitPattern);
        thisRegularExpression->SetLastIndex(0);
        return thisRegularExpression;
    }